

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O1

void allphone_clear_segments(allphone_search_t *allphs)

{
  glist_t pgVar1;
  
  for (pgVar1 = allphs->segments; pgVar1 != (glist_t)0x0; pgVar1 = pgVar1->next) {
    ckd_free((pgVar1->data).ptr);
  }
  glist_free(allphs->segments);
  allphs->segments = (glist_t)0x0;
  return;
}

Assistant:

static void
allphone_clear_segments(allphone_search_t * allphs)
{	
    gnode_t *gn;
    for (gn = allphs->segments; gn; gn = gn->next) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(allphs->segments);
    allphs->segments = NULL;
}